

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O2

Ref<embree::SceneGraph::Node> __thiscall
embree::XMLLoader::load(XMLLoader *this,FileName *fileName,AffineSpace3fa *space,SharedState *state)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
  *this_00;
  Node *pNVar1;
  iterator iVar2;
  mapped_type *pmVar3;
  XMLLoader loader;
  key_type local_118;
  XMLLoader local_f8;
  
  this_00 = &state->sceneMap;
  std::__cxx11::string::string((string *)&local_f8,(string *)fileName);
  iVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
          ::find(&this_00->_M_t,(key_type *)&local_f8);
  std::__cxx11::string::~string((string *)&local_f8);
  if ((_Rb_tree_header *)iVar2._M_node == &(state->sceneMap)._M_t._M_impl.super__Rb_tree_header) {
    XMLLoader(&local_f8,fileName,space,state);
    std::__cxx11::string::string((string *)&local_118,(string *)fileName);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
             ::operator[](this_00,&local_118);
    if (local_f8.root.ptr != (Node *)0x0) {
      (*((local_f8.root.ptr)->super_RefCount)._vptr_RefCount[2])();
    }
    if (pmVar3->ptr != (Node *)0x0) {
      (*(pmVar3->ptr->super_RefCount)._vptr_RefCount[3])();
    }
    pmVar3->ptr = local_f8.root.ptr;
    std::__cxx11::string::~string((string *)&local_118);
    (this->path).filename._M_dataplus._M_p = (pointer)local_f8.root.ptr;
    if (local_f8.root.ptr != (Node *)0x0) {
      (*((local_f8.root.ptr)->super_RefCount)._vptr_RefCount[2])();
    }
    ~XMLLoader(&local_f8);
  }
  else {
    std::__cxx11::string::string((string *)&local_f8,(string *)fileName);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
             ::operator[](this_00,(key_type *)&local_f8);
    pNVar1 = pmVar3->ptr;
    (this->path).filename._M_dataplus._M_p = (pointer)pNVar1;
    if (pNVar1 != (Node *)0x0) {
      (*(pNVar1->super_RefCount)._vptr_RefCount[2])();
    }
    std::__cxx11::string::~string((string *)&local_f8);
  }
  return (Ref<embree::SceneGraph::Node>)(Node *)this;
}

Assistant:

Ref<SceneGraph::Node> XMLLoader::load(const FileName& fileName, const AffineSpace3fa& space, SharedState& state)
  {
    if (state.sceneMap.find(fileName) != state.sceneMap.end())
      return state.sceneMap[fileName];

    XMLLoader loader(fileName,space,state);
    state.sceneMap[fileName] = loader.root;
    return loader.root;
  }